

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

LPWSTR __thiscall
CmdLineArgsParser::ParseString
          (CmdLineArgsParser *this,LPWSTR buffer,size_t ceBuffer,bool fTreatColonAsSeparator)

{
  byte bVar1;
  char16 cVar2;
  Exception *pEVar3;
  bool fDone;
  ulong local_38;
  size_t len;
  char16 *out;
  bool fTreatColonAsSeparator_local;
  size_t ceBuffer_local;
  LPWSTR buffer_local;
  CmdLineArgsParser *this_local;
  
  local_38 = 0;
  cVar2 = CurChar(this);
  if (cVar2 == L'\"') {
    NextChar(this);
    while (cVar2 = CurChar(this), cVar2 != L'\"') {
      cVar2 = CurChar(this);
      if (cVar2 == L'\0') {
        pEVar3 = (Exception *)__cxa_allocate_exception(8);
        Exception::Exception(pEVar3,L"Unmatched quote");
        __cxa_throw(pEVar3,&Exception::typeinfo,0);
      }
      if (ceBuffer - 1 <= local_38) {
        pEVar3 = (Exception *)__cxa_allocate_exception(8);
        Exception::Exception(pEVar3,L"String token too large to parse");
        __cxa_throw(pEVar3,&Exception::typeinfo,0);
      }
      cVar2 = CurChar(this);
      buffer[local_38] = cVar2;
      NextChar(this);
      local_38 = local_38 + 1;
    }
    NextChar(this);
  }
  else {
    bVar1 = 0;
    while ((bool)(bVar1 ^ 1)) {
      cVar2 = CurChar(this);
      if (((cVar2 == L'\0') || (cVar2 == L' ')) || (cVar2 == L',')) {
        bVar1 = 1;
      }
      else if ((((cVar2 == L'-') || (cVar2 == L':')) || (cVar2 == L'=')) && (fTreatColonAsSeparator)
              ) {
        bVar1 = 1;
      }
      else {
        if (0x1fe < local_38) {
          pEVar3 = (Exception *)__cxa_allocate_exception(8);
          Exception::Exception(pEVar3,L"String token too large to parse");
          __cxa_throw(pEVar3,&Exception::typeinfo,0);
        }
        cVar2 = CurChar(this);
        buffer[local_38] = cVar2;
        NextChar(this);
        local_38 = local_38 + 1;
      }
    }
  }
  if (local_38 != 0) {
    buffer[local_38] = L'\0';
    return buffer;
  }
  pEVar3 = (Exception *)__cxa_allocate_exception(8);
  Exception::Exception(pEVar3,L"String Token Expected");
  __cxa_throw(pEVar3,&Exception::typeinfo,0);
}

Assistant:

LPWSTR
CmdLineArgsParser::ParseString(__inout_ecount(ceBuffer) LPWSTR buffer, size_t ceBuffer, bool fTreatColonAsSeparator)
{

    char16 *out = buffer;
    size_t len = 0;

    if('"' == CurChar())
    {
        NextChar();

        while('"' != CurChar())
        {
            if(0 == CurChar())
            {
                throw Exception(_u("Unmatched quote"));
            }

            //
            // MaxTokenSize - 1 because we need 1 extra position for null termination
            //
            if (len >= ceBuffer - 1)
            {
                throw Exception(_u("String token too large to parse"));
            }

            out[len++] = CurChar();

            NextChar();
        }
        NextChar();
    }
    else
    {
        bool fDone = false;

        while(!fDone)
        {
            switch(CurChar())
            {
            case ' ':
            case ',':
            case 0:
                fDone = true;
                break;
            case '-':
            case '=':
            case ':':
                if (fTreatColonAsSeparator)
                {
                    fDone = true;
                    break;
                }
                else
                {
                    // Fallthrough
                }
            default:
                if (len >= MaxTokenSize - 1)
                {
                    throw Exception(_u("String token too large to parse"));
                }
                out[len++] = CurChar();
                NextChar();
            }
        }
    }

    if(0 == len)
    {
        throw Exception(_u("String Token Expected"));
    }

    out[len] = '\0';

    return buffer;
}